

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O0

int testLinkNode(void)

{
  int iVar1;
  VRDataIndex *pVVar2;
  string outputstring;
  VRDataIndex *index;
  int loopctr;
  int out;
  string teststring;
  string xmlstring;
  VRDataIndex *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  VRDataIndex *in_stack_fffffffffffffe90;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [7];
  undefined1 in_stack_fffffffffffffec7;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  VRDataIndex *in_stack_fffffffffffffed8;
  allocator<char> local_119;
  string local_118 [39];
  undefined1 local_f1 [33];
  string local_d0 [32];
  string local_b0 [7];
  undefined1 in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  VRDataIndex *in_stack_ffffffffffffff68;
  string local_90 [32];
  VRDataIndex *local_70;
  int local_64;
  int local_60;
  allocator<char> local_59;
  string local_58 [55];
  allocator<char> local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (allocator<char> *)in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (allocator<char> *)in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(&local_59);
  local_60 = 0;
  for (local_64 = 0; iVar1 = local_60, local_64 < 1; local_64 = local_64 + 1) {
    pVVar2 = (VRDataIndex *)operator_new(0x98);
    MinVR::VRDataIndex::VRDataIndex(in_stack_fffffffffffffe10);
    local_70 = pVVar2;
    std::__cxx11::string::string(local_b0,local_20);
    std::__cxx11::string::string(local_d0,(string *)MinVR::VRDataIndex::rootNameSpace_abi_cxx11_);
    MinVR::VRDataIndex::addSerializedValue
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (bool)in_stack_fffffffffffffec7);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_b0);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
    pVVar2 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)pVVar2,(allocator<char> *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe10 = (VRDataIndex *)&local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)pVVar2,(allocator<char> *)in_stack_fffffffffffffe10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)pVVar2,(allocator<char> *)in_stack_fffffffffffffe10);
    MinVR::VRDataIndex::setAttributeValue
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)pVVar2,(allocator<char> *)in_stack_fffffffffffffe10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)pVVar2,(allocator<char> *)in_stack_fffffffffffffe10);
    MinVR::VRDataIndex::serialize
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (bool)in_stack_ffffffffffffff57);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
    std::allocator<char>::~allocator(&local_189);
    iVar1 = std::__cxx11::string::compare(local_58);
    local_60 = iVar1 + local_60;
    if (local_70 != (VRDataIndex *)0x0) {
      pVVar2 = local_70;
      MinVR::VRDataIndex::~VRDataIndex(local_70);
      operator_delete(pVVar2,0x98);
    }
    std::__cxx11::string::~string(local_168);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_20);
  return iVar1;
}

Assistant:

int testLinkNode() {
  std::string xmlstring =  "<MVR><!-- some of the illegitimate children of John I --><John name=\"Lackland\"><Isabella name=\"Angouleme\"><Henry seq=\"III\" title=\"King\">1</Henry> <Izzie linkNode=\"Isabella\"/><Richard title=\"Earl of Cornwall\">2</Richard> <Joan title=\"Queen Consort\">3</Joan> <Isabella title=\"Queen Consort\">4</Isabella> <Eleanor type=\"string\">5</Eleanor> </Isabella><Joan title=\"Lady of Wales\"><Richard name=\"FitzRoy\">6</Richard><Izzie linkNode=\"Isabella\"/><Oliver name=\"FitzRoy\">7</Oliver></Joan> <Unknown><Geoffrey name=\"FitzRoy\" type=\"string\">8</Geoffrey><John name=\"FitzRoy\">9</John> <Henry name=\"FitzRoy\">10</Henry> <Osbert name=\"Gifford\">11</Osbert><Thomas linkNode=\"/MVR/John/Joan\"/> <Eudes name=\"FitzRoy\">12</Eudes> <Bartholomew name=\"FitzRoy\">13</Bartholomew> <Maud name=\"FitzRoy\" title=\"Abbess of Barking\">14</Maud><Isabella name=\"FitzRoy\">15</Isabella><Philip name=\"FitzRoy\" type=\"string\">16</Philip></Unknown> </John></MVR>";

  std::string teststring="<MVR type=\"container\"><John type=\"container\" name=\"Lackland\"><Isabella type=\"container\" name=\"Angouleme\"><Henry type=\"int\" seq=\"III\" title=\"King\">1</Henry><Izzie type=\"int\" title=\"Queen Consort\">4</Izzie><Richard type=\"int\" title=\"Earl of Cornwall\">2</Richard><Joan type=\"int\" title=\"Queen Consort\">3</Joan><Isabella type=\"int\" title=\"Queen Consort\">4</Isabella><Eleanor type=\"string\">5</Eleanor></Isabella><Joan type=\"container\" letter=\"alpha\" title=\"Lady of Wales\"><Richard type=\"int\" name=\"FitzRoy\">6</Richard><Izzie type=\"container\" name=\"Angouleme\"><Henry type=\"int\" seq=\"III\" title=\"King\">1</Henry><Izzie type=\"int\" title=\"Queen Consort\">4</Izzie><Richard type=\"int\" title=\"Earl of Cornwall\">2</Richard><Joan type=\"int\" title=\"Queen Consort\">3</Joan><Isabella type=\"int\" title=\"Queen Consort\">4</Isabella><Eleanor type=\"string\">5</Eleanor></Izzie><Oliver type=\"int\" name=\"FitzRoy\">7</Oliver></Joan><Unknown type=\"container\"><Geoffrey type=\"string\" name=\"FitzRoy\">8</Geoffrey><John type=\"int\" name=\"FitzRoy\">9</John><Henry type=\"int\" name=\"FitzRoy\">10</Henry><Osbert type=\"int\" name=\"Gifford\">11</Osbert><Thomas type=\"container\" letter=\"alpha\" title=\"Lady of Wales\"><Richard type=\"int\" name=\"FitzRoy\">6</Richard><Izzie type=\"container\" name=\"Angouleme\"><Henry type=\"int\" seq=\"III\" title=\"King\">1</Henry><Izzie type=\"int\" title=\"Queen Consort\">4</Izzie><Richard type=\"int\" title=\"Earl of Cornwall\">2</Richard><Joan type=\"int\" title=\"Queen Consort\">3</Joan><Isabella type=\"int\" title=\"Queen Consort\">4</Isabella><Eleanor type=\"string\">5</Eleanor></Izzie><Oliver type=\"int\" name=\"FitzRoy\">7</Oliver></Thomas><Eudes type=\"int\" name=\"FitzRoy\">12</Eudes><Bartholomew type=\"int\" name=\"FitzRoy\">13</Bartholomew><Maud type=\"int\" name=\"FitzRoy\" title=\"Abbess of Barking\">14</Maud><Isabella type=\"int\" name=\"FitzRoy\">15</Isabella><Philip type=\"string\" name=\"FitzRoy\">16</Philip></Unknown></John></MVR>";
  int out = 0;

  LOOP {
    MinVR::VRDataIndex *index = new MinVR::VRDataIndex();
    index->addSerializedValue(xmlstring, MinVR::VRDataIndex::rootNameSpace);


    // To prove that the linked nodes are actually the same node.  We
    // adjust one node's attributes to make sure it appears at the copy,
    // as well.
    index->setAttributeValue("/MVR/John/Unknown/Thomas", "letter", "alpha");

    std::string outputstring = index->serialize("/MVR");

    out += teststring.compare(outputstring);
    delete index;
  }